

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O3

CEPlanet * CEPlanet::Earth(void)

{
  CEPlanet *in_RDI;
  CEAngle CStack_68;
  CEAngle local_58;
  CESkyCoordType local_44;
  string local_40;
  double local_20;
  double local_18;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Earth","");
  local_18 = 0.0;
  CEAngle::CEAngle(&local_58,&local_18);
  local_20 = 0.0;
  CEAngle::CEAngle(&CStack_68,&local_20);
  local_44 = CIRS;
  CEPlanet(in_RDI,&local_40,&local_58,&CStack_68,&local_44);
  CEAngle::~CEAngle(&CStack_68);
  CEAngle::~CEAngle(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  in_RDI->semi_major_axis_au_ = 1.00000018;
  in_RDI->eccentricity_ = 0.01673163;
  in_RDI->semi_major_axis_au_per_cent_ = -3e-08;
  in_RDI->eccentricity_per_cent_ = -3.661e-05;
  in_RDI->inclination_deg_ = -0.00054346;
  in_RDI->mean_longitude_deg_ = 100.46691572;
  in_RDI->inclination_deg_per_cent_ = -0.766146558577444;
  in_RDI->mean_longitude_deg_per_cent_ = 35999.37306329;
  in_RDI->perihelion_lon_deg_ = 102.93005885;
  in_RDI->ascending_node_lon_deg_ = -5.11260389;
  in_RDI->perihelion_long_deg_per_cent_ = 0.3179526;
  in_RDI->ascending_node_lon_deg_per_cent_ = -0.24123856;
  in_RDI->radius_m_ = 0.0;
  in_RDI->mass_kg_ = 0.0;
  in_RDI->albedo_ = 0.0;
  in_RDI->sofa_planet_id_ = 3.5;
  return in_RDI;
}

Assistant:

CEPlanet CEPlanet::Earth()
{
    CEPlanet earth("Earth", 0.0, 0.0) ;
    earth.SetSemiMajorAxis_AU(1.00000018, -0.00000003) ;
    earth.SetEccentricity(0.01673163, -0.00003661) ;
    earth.SetInclination(-0.00054346, -0.01337178, CEAngleType::DEGREES) ;
    earth.SetMeanLongitude(100.46691572, 35999.37306329, CEAngleType::DEGREES) ;
    earth.SetPerihelionLongitude(102.93005885, 0.31795260, CEAngleType::DEGREES) ;
    earth.SetAscendingNodeLongitude(-5.11260389, -0.24123856, CEAngleType::DEGREES) ;
    
    // Set planetary properties
    earth.SetMeanRadius_m(0.0) ;
    earth.SetAlbedo(0.0) ;
    earth.SetMass_kg(0.0) ;
    
    // Set the sofa planet ID
    earth.SetSofaID(3.5) ;
    
    return earth ;
}